

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy.c
# Opt level: O0

void * memcpy(void *__dest,void *__src,size_t __n)

{
  char *local_30;
  char *src;
  char *dest;
  size_t n_local;
  void *s2_local;
  void *s1_local;
  
  local_30 = (char *)__src;
  src = (char *)__dest;
  dest = (char *)__n;
  while (dest != (char *)0x0) {
    *src = *local_30;
    local_30 = local_30 + 1;
    src = src + 1;
    dest = dest + -1;
  }
  return __dest;
}

Assistant:

void * memcpy( void * _PDCLIB_restrict s1, const void * _PDCLIB_restrict s2, size_t n )
{
    char * dest = ( char * ) s1;
    const char * src = ( const char * ) s2;

    while ( n-- )
    {
        *dest++ = *src++;
    }

    return s1;
}